

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoadConstantLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint64_t uVar1;
  undefined8 layer_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  string *psVar5;
  mapped_type_conflict1 *pmVar6;
  LoadConstantLayerParams *this_00;
  WeightParams *pWVar7;
  uint64 uVar8;
  allocator local_2f1;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  Result local_2a8;
  allocator local_279;
  string local_278;
  allocator local_251;
  string local_250;
  Result local_230;
  int local_204;
  uint64_t uStack_200;
  int i;
  size_t total_shape;
  undefined1 local_1d8 [8];
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  string err;
  WeightParamType paramType;
  LoadConstantLayerParams *params;
  string local_138;
  allocator local_111;
  string local_110;
  Result local_f0;
  mapped_type_conflict1 local_c4;
  iterator iStack_c0;
  int rank;
  _Self local_b8;
  undefined4 local_ac;
  Result local_a8;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,0,0);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar2 = Result::good((Result *)local_48);
  if (bVar2) {
    validateOutputCount(&local_a8,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
    Result::operator=((Result *)local_48,&local_a8);
    Result::~Result(&local_a8);
  }
  bVar2 = Result::good((Result *)local_48);
  if (bVar2) {
    if ((this->ndArrayInterpretation & 1U) != 0) {
      psVar5 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,0);
      local_b8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find(&this->blobNameToRank,psVar5);
      iStack_c0 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::end(&this->blobNameToRank);
      bVar2 = std::operator!=(&local_b8,&stack0xffffffffffffff40);
      if (bVar2) {
        psVar5 = Specification::NeuralNetworkLayer::output_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,0);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::at(&this->blobNameToRank,psVar5);
        layer_00 = r.m_message.field_2._8_8_;
        local_c4 = *pmVar6;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_110,"LoadConstant",&local_111);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_138,"output",(allocator *)((long)&params + 7))
        ;
        checkRank(&local_f0,(NeuralNetworkLayer *)layer_00,&local_110,5,5,&local_138,local_c4);
        Result::operator=((Result *)local_48,&local_f0);
        Result::~Result(&local_f0);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
        bVar2 = Result::good((Result *)local_48);
        if (!bVar2) {
          Result::Result(__return_storage_ptr__,(Result *)local_48);
          local_ac = 1;
          goto LAB_00a26acf;
        }
      }
    }
    this_00 = Specification::NeuralNetworkLayer::loadconstant
                        ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    pWVar7 = Specification::LoadConstantLayerParams::data(this_00);
    err.field_2._12_4_ = valueType(pWVar7);
    if (err.field_2._12_4_ == UNSPECIFIED) {
      psVar5 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      std::operator+(&local_190,"Load constant layer \'",psVar5);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                     &local_190,
                     "\' has both full precision and half precision weight fields populated");
      std::__cxx11::string::~string((string *)&local_190);
      Result::Result((Result *)((long)&err_1.field_2 + 8),INVALID_MODEL_PARAMETERS,
                     (string *)local_170);
      Result::operator=((Result *)local_48,(Result *)((long)&err_1.field_2 + 8));
      Result::~Result((Result *)((long)&err_1.field_2 + 8));
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      std::__cxx11::string::~string((string *)local_170);
    }
    else {
      iVar3 = Specification::LoadConstantLayerParams::shape_size(this_00);
      if (iVar3 == 3) {
        uStack_200 = 1;
        for (local_204 = 0; iVar3 = local_204,
            iVar4 = Specification::LoadConstantLayerParams::shape_size(this_00), iVar3 < iVar4;
            local_204 = local_204 + 1) {
          uVar8 = Specification::LoadConstantLayerParams::shape(this_00,local_204);
          uStack_200 = uVar8 * uStack_200;
        }
        iVar3 = Specification::LoadConstantLayerParams::shape_size(this_00);
        if ((iVar3 == 3) &&
           (uVar8 = Specification::LoadConstantLayerParams::shape(this_00,0), 1 < uVar8)) {
          pWVar7 = Specification::LoadConstantLayerParams::data(this_00);
          uVar1 = uStack_200;
          uVar8 = Specification::LoadConstantLayerParams::shape(this_00,0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_250,"LoadConstant",&local_251);
          psVar5 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_278,"constants",&local_279);
          validateGeneralWeightParams(&local_230,pWVar7,uVar1,uVar8,&local_250,psVar5,&local_278);
          Result::operator=((Result *)local_48,&local_230);
          Result::~Result(&local_230);
          std::__cxx11::string::~string((string *)&local_278);
          std::allocator<char>::~allocator((allocator<char> *)&local_279);
          std::__cxx11::string::~string((string *)&local_250);
          std::allocator<char>::~allocator((allocator<char> *)&local_251);
        }
        else {
          pWVar7 = Specification::LoadConstantLayerParams::data(this_00);
          uVar1 = uStack_200;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2c8,"LoadConstant",&local_2c9);
          psVar5 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2f0,"constants",&local_2f1);
          validateGeneralWeightParams(&local_2a8,pWVar7,uVar1,1,&local_2c8,psVar5,&local_2f0);
          Result::operator=((Result *)local_48,&local_2a8);
          Result::~Result(&local_2a8);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
        }
        bVar2 = Result::good((Result *)local_48);
        if (bVar2) {
          Result::Result(__return_storage_ptr__);
          local_ac = 1;
        }
        else {
          Result::Result(__return_storage_ptr__,(Result *)local_48);
          local_ac = 1;
        }
      }
      else {
        psVar5 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &total_shape,"Load constant layer \'",psVar5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &total_shape,"\' must be a 3D constant.");
        std::__cxx11::string::~string((string *)&total_shape);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1d8);
        local_ac = 1;
        std::__cxx11::string::~string((string *)local_1d8);
      }
    }
  }
  else {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
  }
LAB_00a26acf:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoadConstantLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 0, 0);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        if (blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
            int rank = blobNameToRank.at(layer.output(0));
            r = checkRank(layer, "LoadConstant", 5, 5, "output", rank);
            if (!r.good()) {return r;}
        }
    }

    const auto& params = layer.loadconstant();
    WeightParamType paramType = valueType(params.data());

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        std::string err = "Load constant layer '" + layer.name() + "' has both full precision and half precision weight fields populated";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (params.shape_size() != 3) {
        std::string err = "Load constant layer '" + layer.name() + "' must be a 3D constant.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }
    if (params.shape_size() == 3 && params.shape(0) > 1){
        r = validateGeneralWeightParams(params.data(), total_shape, params.shape(0), "LoadConstant", layer.name(), "constants");
    } else {
        r = validateGeneralWeightParams(params.data(), total_shape, 1, "LoadConstant", layer.name(), "constants");
    }

    if (!r.good()) return r;

    return Result();
}